

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O3

SW_FT_Error SW_FT_Stroker_ParseOutline(SW_FT_Stroker stroker,SW_FT_Outline *outline)

{
  SW_FT_Bool SVar1;
  SW_FT_Vector *pSVar2;
  char *pcVar3;
  SW_FT_Pos *pSVar4;
  uint uVar5;
  SW_FT_Error SVar6;
  uint uVar7;
  SW_FT_Vector *pSVar8;
  SW_FT_Vector *pSVar9;
  byte *pbVar10;
  long lVar11;
  SW_FT_Vector *pSVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  SW_FT_Vector vec;
  SW_FT_Vector v_start;
  SW_FT_Vector v_control;
  SW_FT_Vector vec2;
  SW_FT_Vector vec_1;
  SW_FT_Vector local_a8;
  SW_FT_Vector local_98;
  SW_FT_Vector local_88;
  SW_FT_Vector local_78;
  SW_FT_Outline *local_68;
  SW_FT_Vector *local_60;
  SW_FT_Vector *local_58;
  ulong local_50;
  SW_FT_Vector local_48;
  
  SVar6 = -1;
  if (stroker != (SW_FT_Stroker)0x0 && outline != (SW_FT_Outline *)0x0) {
    SVar6 = 0;
    stroker->borders[0].num_points = 0;
    stroker->borders[0].start = -1;
    stroker->borders[0].valid = '\0';
    stroker->borders[1].num_points = 0;
    stroker->borders[1].start = -1;
    stroker->borders[1].valid = '\0';
    if (0 < outline->n_contours) {
      local_58 = &stroker->center;
      local_60 = &stroker->subpath_start;
      lVar11 = 0;
      uVar5 = 0;
      local_68 = outline;
      do {
        uVar7 = (uint)outline->contours[lVar11];
        local_50 = (ulong)uVar7;
        if (uVar5 < uVar7) {
          pSVar2 = outline->points;
          pSVar12 = pSVar2 + local_50;
          pSVar8 = pSVar2 + uVar5;
          lVar14 = pSVar2[uVar5].x;
          local_98.y = pSVar2[uVar5].y;
          local_98.x = pSVar12->x;
          pSVar4 = &pSVar12->y;
          local_88.x = pSVar2[uVar5].x;
          local_88.y = pSVar2[uVar5].y;
          pcVar3 = outline->tags;
          pbVar10 = (byte *)(pcVar3 + uVar5);
          if ((pcVar3[uVar5] & 3U) == 0) {
            if ((pcVar3[local_50] & 3U) == 1) {
              pSVar12 = pSVar12 + -1;
              local_98.y = *pSVar4;
            }
            else {
              local_98.x = local_98.x + lVar14;
              lVar14 = *pSVar4 + local_98.y;
              uVar15 = local_98.x - (local_98.x >> 0x3f);
              uVar16 = lVar14 - (lVar14 >> 0x3f);
              local_98.x = CONCAT44((int)((long)uVar15 >> 0x21),(int)(uVar15 >> 1));
              local_88.x = CONCAT44((int)((long)uVar16 >> 0x21),(int)(uVar16 >> 1));
            }
            pSVar8 = pSVar8 + -1;
            pbVar10 = pbVar10 + -1;
          }
          else {
            local_98.x = lVar14;
            if ((pcVar3[uVar5] & 3U) == 2) {
              return -2;
            }
          }
          SVar1 = outline->contours_flag[lVar11];
          stroker->first_point = '\x01';
          local_58->x = local_98.x;
          local_58->y = local_98.y;
          stroker->subpath_open = SVar1;
          bVar13 = true;
          if (stroker->line_join == SW_FT_STROKER_LINEJOIN_ROUND) {
            if (SVar1 == '\0') {
              bVar13 = false;
            }
            else {
              bVar13 = stroker->line_cap == SW_FT_STROKER_LINECAP_BUTT;
            }
          }
          stroker->handle_wide_strokes = bVar13;
          local_60->x = local_98.x;
          local_60->y = local_98.y;
          stroker->angle_in = 0;
          while (pSVar8 < pSVar12) {
            pSVar2 = pSVar8 + 1;
            if ((pbVar10[1] & 3) == 0) {
              local_88.x = pSVar2->x;
              local_88.y = pSVar8[1].y;
              if (pSVar12 <= pSVar2) {
LAB_0010c43f:
                SW_FT_Stroker_ConicTo(stroker,&local_88,&local_98);
                break;
              }
              pbVar10 = pbVar10 + 2;
              pSVar8 = pSVar8 + 2;
              while( true ) {
                local_a8.x = pSVar8->x;
                local_a8.y = pSVar8->y;
                if ((*pbVar10 & 3) != 0) break;
                uVar15 = (local_a8.x + local_88.x) - (local_a8.x + local_88.x >> 0x3f);
                uVar16 = (local_a8.y + local_88.y) - (local_a8.y + local_88.y >> 0x3f);
                local_78.x = CONCAT44((int)((long)uVar15 >> 0x21),(int)(uVar15 >> 1));
                local_68 = (SW_FT_Outline *)CONCAT44((int)((long)uVar16 >> 0x21),(int)(uVar16 >> 1))
                ;
                SW_FT_Stroker_ConicTo(stroker,&local_88,&local_78);
                local_88.x = local_a8.x;
                local_88.y = local_a8.y;
                pbVar10 = pbVar10 + 1;
                bVar13 = pSVar12 <= pSVar8;
                pSVar8 = pSVar8 + 1;
                if (bVar13) goto LAB_0010c43f;
              }
              if ((*pbVar10 & 3) != 1) {
                return -2;
              }
              SW_FT_Stroker_ConicTo(stroker,&local_88,&local_a8);
            }
            else if ((pbVar10[1] & 3) == 1) {
              pbVar10 = pbVar10 + 1;
              local_a8.x = pSVar2->x;
              local_a8.y = pSVar8[1].y;
              SW_FT_Stroker_LineTo(stroker,&local_a8);
              pSVar8 = pSVar2;
            }
            else {
              if (pSVar12 < pSVar8 + 2) {
                return -2;
              }
              if ((pbVar10[2] & 3) != 2) {
                return -2;
              }
              pSVar9 = pSVar8 + 3;
              local_a8.x = pSVar2->x;
              local_a8.y = pSVar8[1].y;
              local_78.x = pSVar8[2].x;
              local_78.y = pSVar8[2].y;
              if (pSVar12 < pSVar9) {
                SW_FT_Stroker_CubicTo(stroker,&local_a8,&local_78,&local_98);
                break;
              }
              pbVar10 = pbVar10 + 3;
              local_48.x = pSVar9->x;
              local_48.y = pSVar8[3].y;
              SW_FT_Stroker_CubicTo(stroker,&local_a8,&local_78,&local_48);
              pSVar8 = pSVar9;
            }
          }
          outline = local_68;
          uVar7 = (uint)local_50;
          if (stroker->first_point == '\0') {
            SW_FT_Stroker_EndSubPath(stroker);
          }
        }
        uVar5 = uVar7 + 1;
        lVar11 = lVar11 + 1;
      } while (lVar11 < outline->n_contours);
      SVar6 = 0;
    }
  }
  return SVar6;
}

Assistant:

SW_FT_Error SW_FT_Stroker_ParseOutline(SW_FT_Stroker        stroker,
                                       const SW_FT_Outline* outline)
{
    SW_FT_Vector v_last;
    SW_FT_Vector v_control;
    SW_FT_Vector v_start;

    SW_FT_Vector* point;
    SW_FT_Vector* limit;
    char*         tags;

    SW_FT_Error error;

    SW_FT_Int  n;     /* index of contour in outline     */
    SW_FT_UInt first; /* index of first point in contour */
    SW_FT_Int  tag;   /* current point's state           */

    if (!outline || !stroker) return -1;  // SW_FT_THROW( Invalid_Argument );

    SW_FT_Stroker_Rewind(stroker);

    first = 0;

    for (n = 0; n < outline->n_contours; n++) {
        SW_FT_UInt last; /* index of last point in contour */

        last = outline->contours[n];
        limit = outline->points + last;

        /* skip empty points; we don't stroke these */
        if (last <= first) {
            first = last + 1;
            continue;
        }

        v_start = outline->points[first];
        v_last = outline->points[last];

        v_control = v_start;

        point = outline->points + first;
        tags = outline->tags + first;
        tag = SW_FT_CURVE_TAG(tags[0]);

        /* A contour cannot start with a cubic control point! */
        if (tag == SW_FT_CURVE_TAG_CUBIC) goto Invalid_Outline;

        /* check first point to determine origin */
        if (tag == SW_FT_CURVE_TAG_CONIC) {
            /* First point is conic control.  Yes, this happens. */
            if (SW_FT_CURVE_TAG(outline->tags[last]) == SW_FT_CURVE_TAG_ON) {
                /* start at last point if it is on the curve */
                v_start = v_last;
                limit--;
            } else {
                /* if both first and last points are conic, */
                /* start at their middle                    */
                v_start.x = (v_start.x + v_last.x) / 2;
                v_start.y = (v_start.y + v_last.y) / 2;
            }
            point--;
            tags--;
        }

        error = SW_FT_Stroker_BeginSubPath(stroker, &v_start, outline->contours_flag[n]);
        if (error) goto Exit;

        while (point < limit) {
            point++;
            tags++;

            tag = SW_FT_CURVE_TAG(tags[0]);
            switch (tag) {
            case SW_FT_CURVE_TAG_ON: /* emit a single line_to */
            {
                SW_FT_Vector vec;

                vec.x = point->x;
                vec.y = point->y;

                error = SW_FT_Stroker_LineTo(stroker, &vec);
                if (error) goto Exit;
                continue;
            }

            case SW_FT_CURVE_TAG_CONIC: /* consume conic arcs */
                v_control.x = point->x;
                v_control.y = point->y;

            Do_Conic:
                if (point < limit) {
                    SW_FT_Vector vec;
                    SW_FT_Vector v_middle;

                    point++;
                    tags++;
                    tag = SW_FT_CURVE_TAG(tags[0]);

                    vec = point[0];

                    if (tag == SW_FT_CURVE_TAG_ON) {
                        error =
                            SW_FT_Stroker_ConicTo(stroker, &v_control, &vec);
                        if (error) goto Exit;
                        continue;
                    }

                    if (tag != SW_FT_CURVE_TAG_CONIC) goto Invalid_Outline;

                    v_middle.x = (v_control.x + vec.x) / 2;
                    v_middle.y = (v_control.y + vec.y) / 2;

                    error =
                        SW_FT_Stroker_ConicTo(stroker, &v_control, &v_middle);
                    if (error) goto Exit;

                    v_control = vec;
                    goto Do_Conic;
                }

                error = SW_FT_Stroker_ConicTo(stroker, &v_control, &v_start);
                goto Close;

            default: /* SW_FT_CURVE_TAG_CUBIC */
            {
                SW_FT_Vector vec1, vec2;

                if (point + 1 > limit ||
                    SW_FT_CURVE_TAG(tags[1]) != SW_FT_CURVE_TAG_CUBIC)
                    goto Invalid_Outline;

                point += 2;
                tags += 2;

                vec1 = point[-2];
                vec2 = point[-1];

                if (point <= limit) {
                    SW_FT_Vector vec;

                    vec = point[0];

                    error = SW_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &vec);
                    if (error) goto Exit;
                    continue;
                }

                error = SW_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &v_start);
                goto Close;
            }
            }
        }

    Close:
        if (error) goto Exit;

        /* don't try to end the path if no segments have been generated */
        if (!stroker->first_point) {
            error = SW_FT_Stroker_EndSubPath(stroker);
            if (error) goto Exit;
        }

        first = last + 1;
    }

    return 0;

Exit:
    return error;

Invalid_Outline:
    return -2;  // SW_FT_THROW( Invalid_Outline );
}